

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall
fixedPreciseMeasurement_doubleOps_Test::TestBody(fixedPreciseMeasurement_doubleOps_Test *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  precise_unit pVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  fixed_precise_measurement y;
  fixed_precise_measurement f1;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined8 uStack_70;
  AssertHelper local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  undefined1 local_50 [8];
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  fixed_precise_measurement local_30;
  
  local_30.value_ = 1.0;
  local_30.units_.multiplier_ = 1.18575755001899e-321;
  pVar4 = units::precise_unit::operator/
                    ((precise_unit *)units::precise::one,(precise_unit *)units::precise::s);
  local_78 = pVar4._8_8_;
  local_80 = (undefined1  [8])pVar4.multiplier_;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_50,"freq.units()","precise::one / precise::s",
             (precise_unit *)&local_30,(precise_unit *)local_80);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x33a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"freq2.value()","18.0",18.0,18.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x33c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"f4.value()","27.0",27.0,27.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x341,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"static_cast<float>(f3.value())","3.0",3.0,3.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x344,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_30.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_30.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_50 = (undefined1  [8])&DAT_3ff0000000000000;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf0;
  local_30.units_.base_units_ = units::detail::unit_data::inv((unit_data *)&local_48);
  uVar2 = ~local_48._4_4_;
  if (local_48._4_4_ == 0) {
    uVar2 = 0;
  }
  local_30.units_.commodity_ = uVar2;
  local_30.value_ = 1.0;
  local_30.units_.multiplier_ = (double)&DAT_3ff0000000000000;
  local_50 = (undefined1  [8])&DAT_3ff0000000000000;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  aStack_40._M_allocated_capacity = 0x10;
  bVar1 = units::fixed_precise_measurement::operator==(&local_30,(precise_measurement *)local_50);
  local_80[0] = (internal)bVar1;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_80,(AssertionResult *)"f1 == (1.0 * precise::s)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x347,(char *)local_50);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50 != (undefined1  [8])&aStack_40) {
      operator_delete((void *)local_50,aStack_40._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_50 = (undefined1  [8])&DAT_3ff0000000000000;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  aStack_40._M_allocated_capacity = 0x10;
  local_80 = (undefined1  [8])local_30.value_;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_30.units_.multiplier_;
  uStack_70._0_4_ = local_30.units_.base_units_;
  uStack_70._4_4_ = local_30.units_.commodity_;
  local_68.data_._0_1_ =
       (internal)
       units::precise_measurement::operator==
                 ((precise_measurement *)local_50,(precise_measurement *)local_80);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_68.data_._0_1_) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)&local_68,
               (AssertionResult *)"(1.0 * precise::s) == f1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x348,(char *)local_50);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50 != (undefined1  [8])&aStack_40) {
      operator_delete((void *)local_50,aStack_40._M_allocated_capacity + 1);
    }
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"fp1.value()","12.0",12.0,12.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x34b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"fp2.value()","12.0",12.0,12.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x34e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"fp3.value()","6.0",6.0,6.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x351,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_50,"fp4.value()","3.0",3.0,3.0);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x354,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_50 = (undefined1  [8])&DAT_4000000000000000;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  aStack_40._M_allocated_capacity = 1;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_80,"y.value()","2.0",2.0,2.0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x357,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_80 = (undefined1  [8])0x4014000000000000;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_3ff0000000000000;
  uStack_70._0_4_ = (unit_data)0x1;
  uStack_70._4_4_ = 0;
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)local_50,(precise_measurement *)local_80);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_80,"y.value()","5.0",(double)local_50,5.0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x359,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_50 = (undefined1  [8])&DAT_401c000000000000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_80,"y.value()","7.0",7.0,7.0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x35b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_68.data_._1_7_,local_68.data_._0_1_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, doubleOps)
{
    fixed_precise_measurement freq(9.0, precise::Hz);
    EXPECT_EQ(freq.units(), precise::one / precise::s);
    auto freq2 = 2.0 * freq;
    EXPECT_DOUBLE_EQ(freq2.value(), 18.0);
    bool res = std::is_same<decltype(freq), decltype(freq2)>::value;
    EXPECT_TRUE(res);

    auto f4 = freq * 3;
    EXPECT_DOUBLE_EQ(f4.value(), 27.0);

    auto f3 = freq / 3;
    EXPECT_DOUBLE_EQ(static_cast<float>(f3.value()), 3.0);

    auto f1 = 9.0 / freq;
    EXPECT_TRUE(f1 == (1.0 * precise::s));
    EXPECT_TRUE((1.0 * precise::s) == f1);

    auto fp1 = freq + 3.0;
    EXPECT_DOUBLE_EQ(fp1.value(), 12.0);

    auto fp2 = 3.0 + freq;
    EXPECT_DOUBLE_EQ(fp2.value(), 12.0);

    auto fp3 = freq - 3.0;
    EXPECT_DOUBLE_EQ(fp3.value(), 6.0);

    auto fp4 = 12.0 - freq;
    EXPECT_DOUBLE_EQ(fp4.value(), 3.0);

    fixed_precise_measurement y(2.0 * precise::m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
}